

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O0

void __thiscall
BlockFilterIndex::BlockFilterIndex
          (BlockFilterIndex *this,
          unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *chain,
          BlockFilterType filter_type,size_t n_cache_size,bool f_memory,bool f_wipe)

{
  bool bVar1;
  invalid_argument *this_00;
  BaseIndex *in_RCX;
  undefined1 in_DL;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  long in_FS_OFFSET;
  string *filter_name;
  path path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  ArgsManager *in_stack_fffffffffffffe00;
  path *in_stack_fffffffffffffe08;
  unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *this_01;
  path *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  BlockFilterType filter_type_00;
  char *in_stack_fffffffffffffe28;
  bool *__args_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  string *utf8_str;
  string *in_stack_fffffffffffffe38;
  unsigned_long *__args_1;
  undefined4 in_stack_fffffffffffffe40;
  unique_ptr<FlatFileSeq,_std::default_delete<FlatFileSeq>_> local_168;
  unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> local_160 [2];
  byte local_14a;
  byte local_149;
  long local_8;
  
  filter_type_00 = (BlockFilterType)((ulong)in_stack_fffffffffffffe18 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_149 = (byte)in_R8D & 1;
  local_14a = in_R9B & 1;
  std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::unique_ptr
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
             in_stack_fffffffffffffdf8,
             (unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)0x92185f);
  BlockFilterTypeName_abi_cxx11_(filter_type_00);
  std::operator+(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  BaseIndex::BaseIndex
            (in_RCX,(unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                    CONCAT44(in_R8D,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(in_stack_fffffffffffffdf8);
  std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::~unique_ptr
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
             in_stack_fffffffffffffe08);
  *in_RDI = &PTR_UpdatedBlockTip_01613dc8;
  *(undefined1 *)(in_RDI + 0x16) = in_DL;
  std::unique_ptr<BaseIndex::DB,std::default_delete<BaseIndex::DB>>::
  unique_ptr<std::default_delete<BaseIndex::DB>,void>
            ((unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)
             in_stack_fffffffffffffdf8);
  FlatFilePos::FlatFilePos((FlatFilePos *)in_stack_fffffffffffffdf8);
  __args_3 = (bool *)(in_RDI + 0x19);
  std::unique_ptr<FlatFileSeq,std::default_delete<FlatFileSeq>>::
  unique_ptr<std::default_delete<FlatFileSeq>,void>
            ((unique_ptr<FlatFileSeq,_std::default_delete<FlatFileSeq>_> *)in_stack_fffffffffffffdf8
            );
  utf8_str = (string *)(in_RDI + 0x1a);
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffdf8);
  __args_1 = in_RDI + 0x1f;
  std::
  unordered_map<uint256,_uint256,_FilterHeaderHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_uint256>_>_>
  ::unordered_map((unordered_map<uint256,_uint256,_FilterHeaderHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_uint256>_>_>
                   *)in_stack_fffffffffffffdf8);
  in_RDI[0x28] = 0;
  in_RDI[0x29] = 0;
  in_RDI[0x26] = 0;
  in_RDI[0x27] = 0;
  uint256::uint256((uint256 *)in_stack_fffffffffffffdf8);
  BlockFilterTypeName_abi_cxx11_(filter_type_00);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (in_stack_fffffffffffffdf8);
  if (bVar1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"unknown filter_type");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  else {
    ArgsManager::GetDataDirNet(in_stack_fffffffffffffe00);
    fs::operator/(in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
    fs::operator/(in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
    fs::u8path(utf8_str);
    fs::operator/(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    fs::path::~path((path *)in_stack_fffffffffffffdf8);
    fs::path::~path((path *)in_stack_fffffffffffffdf8);
    fs::path::~path((path *)in_stack_fffffffffffffdf8);
    fs::path::~path((path *)in_stack_fffffffffffffdf8);
    fs::create_directories((path *)in_stack_fffffffffffffe00);
    fs::path::path((path *)in_stack_fffffffffffffdf8,(path *)0x921b60);
    fs::operator/(in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
    std::make_unique<BaseIndex::DB,fs::path,unsigned_long&,bool&,bool&>
              ((path *)CONCAT44(in_R8D,in_stack_fffffffffffffe40),__args_1,(bool *)utf8_str,__args_3
              );
    this_01 = local_160;
    std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::operator=
              (this_01,(unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)
                       in_stack_fffffffffffffe00);
    std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::~unique_ptr(this_01);
    fs::path::~path((path *)in_stack_fffffffffffffdf8);
    fs::path::~path((path *)in_stack_fffffffffffffdf8);
    std::make_unique<FlatFileSeq,fs::path,char_const(&)[5],unsigned_int_const&>
              ((path *)in_RCX,(char (*) [5])CONCAT44(in_R8D,in_stack_fffffffffffffe40),
               (uint *)__args_1);
    std::unique_ptr<FlatFileSeq,_std::default_delete<FlatFileSeq>_>::operator=
              ((unique_ptr<FlatFileSeq,_std::default_delete<FlatFileSeq>_> *)this_01,&local_168);
    std::unique_ptr<FlatFileSeq,_std::default_delete<FlatFileSeq>_>::~unique_ptr
              ((unique_ptr<FlatFileSeq,_std::default_delete<FlatFileSeq>_> *)this_01);
    fs::path::~path((path *)in_stack_fffffffffffffdf8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

BlockFilterIndex::BlockFilterIndex(std::unique_ptr<interfaces::Chain> chain, BlockFilterType filter_type,
                                   size_t n_cache_size, bool f_memory, bool f_wipe)
    : BaseIndex(std::move(chain), BlockFilterTypeName(filter_type) + " block filter index")
    , m_filter_type(filter_type)
{
    const std::string& filter_name = BlockFilterTypeName(filter_type);
    if (filter_name.empty()) throw std::invalid_argument("unknown filter_type");

    fs::path path = gArgs.GetDataDirNet() / "indexes" / "blockfilter" / fs::u8path(filter_name);
    fs::create_directories(path);

    m_db = std::make_unique<BaseIndex::DB>(path / "db", n_cache_size, f_memory, f_wipe);
    m_filter_fileseq = std::make_unique<FlatFileSeq>(std::move(path), "fltr", FLTR_FILE_CHUNK_SIZE);
}